

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O0

void project_feature_handler_COLD(project_feature_handler_context_t *context)

{
  wchar_t wVar1;
  chunk_conflict *c;
  _Bool _Var2;
  uint32_t uVar3;
  _Bool occupied;
  project_feature_handler_context_t *context_local;
  
  _Var2 = square_isview((chunk *)cave,context->grid);
  if ((_Var2) && (player->timed[2] == 0)) {
    context->obvious = true;
  }
  wVar1 = context->dam;
  uVar3 = Rand_div(900);
  if ((uVar3 + L'ĭ' < wVar1) && (_Var2 = square_isfiery((chunk *)cave,context->grid), _Var2)) {
    _Var2 = square_isoccupied((chunk *)cave,context->grid);
    square_unmark((chunk *)cave,context->grid);
    uVar3 = Rand_div(2);
    if (uVar3 == 0) {
      square_set_feat((chunk *)cave,context->grid,FEAT_FLOOR);
    }
    else {
      uVar3 = Rand_div(2);
      if ((uVar3 != 0) || (_Var2)) {
        square_set_feat((chunk *)cave,context->grid,FEAT_PASS_RUBBLE);
      }
      else {
        square_set_feat((chunk *)cave,context->grid,FEAT_RUBBLE);
      }
    }
    c = cave;
    if (cave->depth == 0) {
      _Var2 = is_daytime();
      expose_to_sun((chunk *)c,(loc)context->grid,_Var2);
    }
  }
  return;
}

Assistant:

static void project_feature_handler_COLD(project_feature_handler_context_t *context)
{
	/* Grid is in line of sight and player is not blind */
	if (square_isview(cave, context->grid) && !player->timed[TMD_BLIND]) {
		/* Observe */
		context->obvious = true;
	}

	/* Sufficiently intense cold can solidify lava. */
	if ((context->dam > randint1(900) + 300) &&
		square_isfiery(cave, context->grid)) {
		bool occupied = square_isoccupied(cave, context->grid);

		square_unmark(cave, context->grid);
		if (one_in_(2)) {
			square_set_feat(cave, context->grid, FEAT_FLOOR);
		} else if (one_in_(2) && !occupied) {
			square_set_feat(cave, context->grid, FEAT_RUBBLE);
		} else {
			square_set_feat(cave, context->grid, FEAT_PASS_RUBBLE);
		}
		if (cave->depth == 0)
			expose_to_sun(cave, context->grid, is_daytime());
	}
}